

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall kratos::DPIFunctionStmtBlock::~DPIFunctionStmtBlock(DPIFunctionStmtBlock *this)

{
  DPIFunctionStmtBlock *this_local;
  
  ~DPIFunctionStmtBlock(this);
  operator_delete(this,0x188);
  return;
}

Assistant:

DPIFunctionStmtBlock(Generator *parent, const std::string &function_name)
        : FunctionStmtBlock(parent, function_name) {}